

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImGuiTabItem *pIVar1;
  ImVec2 *pIVar2;
  float fVar3;
  uint uVar4;
  ImGuiWindow *pIVar5;
  ImVec2 IVar6;
  uint3 uVar7;
  undefined1 auVar8 [16];
  ImGuiContext *pIVar9;
  char *text;
  ulong uVar10;
  bool bVar11;
  ImU32 id;
  int iVar12;
  ImU32 col;
  ImGuiID close_button_id;
  ulong uVar13;
  ImGuiTabItem *pIVar14;
  char *pcVar15;
  int iVar16;
  ImGuiTabItemFlags flags_00;
  int iVar17;
  ImGuiCol idx;
  ulong uVar18;
  char cVar19;
  ImGuiTabItem *pIVar20;
  bool bVar21;
  float fVar22;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImRect bb;
  bool held;
  bool hovered;
  ImRect local_98;
  uint local_84;
  ImVec2 local_80;
  undefined1 local_78 [8];
  ulong uStack_70;
  ImGuiTabItem *local_68;
  ImVec2 local_60;
  ImDrawList *local_58;
  ImGuiWindow *local_50;
  bool *local_48;
  ImVec2 local_40;
  char *local_38;
  
  uStack_70 = (ulong)local_78;
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar9 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  if (pIVar5->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    local_98.Min.x = 3.4028235e+38;
    local_98.Min.y = 3.4028235e+38;
    local_98.Max.x = -3.4028235e+38;
    local_98.Max.y = -3.4028235e+38;
    ItemAdd(&local_98,id,(ImRect *)0x0);
    PopItemFlag();
    return false;
  }
  local_48 = p_open;
  IVar6 = TabItemCalcSize(label,p_open != (bool *)0x0);
  local_78._0_4_ = IVar6.x;
  local_78._4_4_ = IVar6.y;
  if (id == 0) {
LAB_00154751:
    p_open = (bool *)0x0;
  }
  else {
    uVar13 = (ulong)(tab_bar->Tabs).Size;
    bVar21 = 0 < (long)uVar13;
    if (0 < (long)uVar13) {
      p_open = (bool *)(tab_bar->Tabs).Data;
      bVar21 = true;
      if (((ImGuiTabItem *)p_open)->ID != id) {
        pIVar14 = (ImGuiTabItem *)((long)p_open + (uVar13 - 1) * 0x1c);
        uVar10 = 1;
        pIVar20 = (ImGuiTabItem *)p_open;
        do {
          uVar18 = uVar10;
          p_open = (bool *)pIVar14;
          if (uVar13 == uVar18) break;
          p_open = (bool *)(pIVar20 + 1);
          pIVar1 = pIVar20 + 1;
          uVar10 = uVar18 + 1;
          pIVar20 = (ImGuiTabItem *)p_open;
        } while (pIVar1->ID != id);
        bVar21 = uVar18 < uVar13;
      }
    }
    if (!bVar21) goto LAB_00154751;
  }
  local_68 = (ImGuiTabItem *)p_open;
  fVar22 = (float)local_78._4_4_;
  if ((ImGuiTabItem *)p_open == (ImGuiTabItem *)0x0) {
    iVar17 = (tab_bar->Tabs).Size;
    iVar12 = (tab_bar->Tabs).Capacity;
    if (iVar17 == iVar12) {
      iVar17 = iVar17 + 1;
      if (iVar12 == 0) {
        iVar16 = 8;
      }
      else {
        iVar16 = iVar12 / 2 + iVar12;
      }
      if (iVar17 < iVar16) {
        iVar17 = iVar16;
      }
      if (iVar12 < iVar17) {
        unique0x1000011e = extraout_XMM0_Dc;
        local_78._0_4_ = IVar6.x;
        local_78._4_4_ = IVar6.y;
        unique0x10000122 = extraout_XMM0_Dd;
        pIVar14 = (ImGuiTabItem *)MemAlloc((long)iVar17 * 0x1c);
        pIVar20 = (tab_bar->Tabs).Data;
        if (pIVar20 != (ImGuiTabItem *)0x0) {
          memcpy(pIVar14,pIVar20,(long)(tab_bar->Tabs).Size * 0x1c);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = pIVar14;
        (tab_bar->Tabs).Capacity = iVar17;
      }
    }
    pIVar14 = (tab_bar->Tabs).Data;
    iVar17 = (tab_bar->Tabs).Size;
    pIVar20 = pIVar14 + iVar17;
    pIVar20->ID = 0;
    pIVar20->Flags = 0;
    pIVar20->LastFrameVisible = -1;
    pIVar20->LastFrameSelected = -1;
    pIVar14[iVar17].Offset = 0.0;
    pIVar14[iVar17].Width = 0.0;
    pIVar14[iVar17].WidthContents = 0.0;
    iVar17 = (tab_bar->Tabs).Size;
    (tab_bar->Tabs).Size = iVar17 + 1;
    pIVar20 = (tab_bar->Tabs).Data;
    local_68 = pIVar20 + iVar17;
    local_68->ID = id;
    pIVar20[iVar17].Width = (float)local_78._0_4_;
    fVar22 = (float)local_78._4_4_;
  }
  tab_bar->LastTabItemIdx =
       (short)((uint)((int)local_68 - *(int *)&(tab_bar->Tabs).Data) >> 2) * 0x6db7;
  local_68->WidthContents = (float)local_78._0_4_;
  local_84 = tab_bar->Flags;
  iVar12 = tab_bar->PrevFrameVisible + 1;
  iVar17 = pIVar9->FrameCount;
  iVar16 = local_68->LastFrameVisible + 1;
  local_68->LastFrameVisible = iVar17;
  local_68->Flags = flags;
  if (iVar16 < iVar17) {
    if ((((local_84 & 2) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
       ((iVar17 <= iVar12 || (tab_bar->SelectedTabId == 0)))) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  else if ((local_84 & 1) == 0) {
    fVar3 = tab_bar->OffsetNextTab;
    local_68->Offset = fVar3;
    tab_bar->OffsetNextTab = local_68->Width + (pIVar9->Style).ItemInnerSpacing.x + fVar3;
  }
  uVar7 = (uint3)(id >> 8);
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    local_78 = (undefined1  [8])CONCAT71((uint7)uVar7,1);
LAB_001548f1:
  }
  else {
    if ((tab_bar->SelectedTabId == 0 && iVar12 < iVar17) && ((tab_bar->Tabs).Size == 1)) {
      local_78 = (undefined1  [8])(ulong)CONCAT31(uVar7,(local_84 & 2) == 0);
      goto LAB_001548f1;
    }
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uStack_70;
    _local_78 = auVar8 << 0x40;
  }
  if ((iVar16 < iVar17) && ((ImGuiTabItem *)p_open == (ImGuiTabItem *)0x0 || iVar17 <= iVar12)) {
    PushItemFlag(0x18,true);
    local_98.Min.x = 3.4028235e+38;
    local_98.Min.y = 3.4028235e+38;
    local_98.Max.x = -3.4028235e+38;
    local_98.Max.y = -3.4028235e+38;
    ItemAdd(&local_98,id,(ImRect *)0x0);
    PopItemFlag();
    return (bool)local_78[0];
  }
  if (tab_bar->SelectedTabId == id) {
    local_68->LastFrameSelected = iVar17;
  }
  local_60 = (pIVar5->DC).CursorPos;
  local_98.Max.x = local_68->Width;
  IVar6 = (tab_bar->BarRect).Min;
  local_98.Min.x = ((float)(int)local_68->Offset - tab_bar->ScrollingAnim) + IVar6.x;
  local_98.Min.y = IVar6.y + 0.0;
  IVar6.y = local_98.Min.y;
  IVar6.x = local_98.Min.x;
  (pIVar5->DC).CursorPos = IVar6;
  local_98.Max.x = local_98.Max.x + local_98.Min.x;
  local_98.Max.y = fVar22 + local_98.Min.y;
  fVar3 = (tab_bar->BarRect).Min.x;
  bVar21 = true;
  if (fVar3 <= local_98.Min.x) {
    bVar21 = (tab_bar->BarRect).Max.x <= local_98.Max.x;
  }
  local_50 = pIVar5;
  local_38 = label;
  if (bVar21) {
    local_40.x = (float)(~-(uint)(fVar3 <= local_98.Min.x) & (uint)fVar3 |
                        (uint)local_98.Min.x & -(uint)(fVar3 <= local_98.Min.x));
    local_40.y = local_98.Min.y + -1.0;
    local_80.x = (tab_bar->BarRect).Max.x;
    local_80.y = fVar22 + local_98.Min.y;
    PushClipRect(&local_40,&local_80,true);
  }
  ItemSize(&local_98,(pIVar9->Style).FramePadding.y);
  bVar11 = ItemAdd(&local_98,id,(ImRect *)0x0);
  if (!bVar11) {
    if (bVar21) {
      PopClipRect();
    }
    (local_50->DC).CursorPos = local_60;
    return (bool)local_78[0];
  }
  bVar11 = ButtonBehavior(&local_98,id,(bool *)&local_40,(bool *)&local_80,
                          (uint)pIVar9->DragDropActive << 0xc | 0x44);
  pIVar5 = local_50;
  local_40.x = (float)CONCAT31(local_40.x._1_3_,local_40.x._0_1_ | pIVar9->HoveredId == id);
  cVar19 = local_78[0];
  if ((bVar11) || ((flags & 2U) != 0 && cVar19 == '\0')) {
    tab_bar->NextSelectedTabId = id;
  }
  if (local_80.x._0_1_ == '\0') {
    SetItemAllowOverlap();
  }
  if ((((iVar16 < iVar17) || (local_80.x._0_1_ == '\0')) ||
      (bVar11 = IsMouseDragging(0,-1.0), !bVar11)) ||
     ((pIVar9->DragDropActive != false || ((tab_bar->Flags & 1) == 0)))) goto LAB_00154b83;
  fVar22 = (pIVar9->IO).MouseDelta.x;
  if (fVar22 < 0.0) {
    iVar17 = -1;
    pIVar2 = &(pIVar9->IO).MousePos;
    if (local_98.Min.x < pIVar2->x || local_98.Min.x == pIVar2->x) goto LAB_00154b56;
  }
  else {
LAB_00154b56:
    if (fVar22 <= 0.0) goto LAB_00154b83;
    iVar17 = 1;
    if ((pIVar9->IO).MousePos.x <= local_98.Max.x) goto LAB_00154b83;
  }
  tab_bar->ReorderRequestTabId = local_68->ID;
  tab_bar->ReorderRequestDir = iVar17;
LAB_00154b83:
  local_58 = pIVar5->DrawList;
  idx = 0x22;
  if ((local_80.x._0_1_ == '\0') && (local_40.x._0_1_ == '\0')) {
    if (cVar19 == '\0') {
      idx = (uint)((local_84 >> 0x16 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_84 >> 0x16 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(local_58,&local_98,flags_00,col);
  RenderNavHighlight(&local_98,id,1);
  bVar11 = IsItemHovered(8);
  if ((bVar11) &&
     ((bVar11 = IsMouseClicked(1,false), bVar11 || (bVar11 = IsMouseReleased(1), bVar11)))) {
    tab_bar->NextSelectedTabId = id;
  }
  uVar4 = tab_bar->Flags;
  if (local_48 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = ImGuiWindow::GetID(pIVar5,(void *)((ulong)id + 1));
  }
  text = local_38;
  IVar6 = local_60;
  bVar11 = TabItemLabelAndCloseButton
                     (local_58,&local_98,uVar4 & 4 | flags,local_38,id,close_button_id);
  if (bVar11) {
    *local_48 = false;
    if (tab_bar->VisibleTabId == local_68->ID) {
      if ((local_68->Flags & 1U) == 0) {
        local_68->LastFrameVisible = -1;
        tab_bar->SelectedTabId = 0;
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else if ((local_68->Flags & 1U) != 0) {
      tab_bar->NextSelectedTabId = local_68->ID;
    }
  }
  if (bVar21) {
    PopClipRect();
  }
  (pIVar5->DC).CursorPos = IVar6;
  if ((((pIVar9->HoveredId == id) && (local_80.x._0_1_ == '\0')) &&
      (0.5 < pIVar9->HoveredIdNotActiveTimer)) && ((tab_bar->Flags & 0x20) == 0)) {
    pcVar15 = FindRenderedTextEnd(text,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar15 - (int)text),text);
  }
  return (bool)cVar19;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->WidthContents = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated

    // Lock visibility
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    if (tab_appearing && !(tab_bar_appearing && !tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2((float)(int)tab->Offset - tab_bar->ScrollingAnim, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x >= tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ItemSize(bb, style.FramePadding.y);
    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    hovered |= (g.HoveredId == id);
    if (pressed || ((flags & ImGuiTabItemFlags_SetSelected) && !tab_contents_visible)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->WidthContents)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + (float)(int)ImLerp(bb.GetWidth(), tab->WidthContents, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f));
        display_draw_list = GetOverlayDrawList(window);
        TabItemRenderBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, label, id, close_button_id);
    if (just_closed)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f)
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}